

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

double __thiscall
chrono::fea::ChElementHexaANCF_3813_9::Calc_detJ0
          (ChElementHexaANCF_3813_9 *this,double x,double y,double z,ShapeVector *Nx,ShapeVector *Ny
          ,ShapeVector *Nz,ChMatrixNM<double,_1,_3> *Nx_d0,ChMatrixNM<double,_1,_3> *Ny_d0,
          ChMatrixNM<double,_1,_3> *Nz_d0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ChMatrixNM<double,_11,_3> *pCVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Product<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_Eigen::Matrix<double,_11,_3,_1,_11,_3>,_0>
  local_40;
  
  ShapeFunctionsDerivativeX(this,Nx,x,y,z);
  ShapeFunctionsDerivativeY(this,Ny,x,y,z);
  ShapeFunctionsDerivativeZ(this,Nz,x,y,z);
  pCVar10 = &this->m_d0;
  local_40.m_lhs = Nx;
  local_40.m_rhs = pCVar10;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,11,1,1,11>,Eigen::Matrix<double,11,3,1,11,3>,0>>
            (Nx_d0,&local_40);
  local_40.m_lhs = Ny;
  local_40.m_rhs = pCVar10;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,11,1,1,11>,Eigen::Matrix<double,11,3,1,11,3>,0>>
            (Ny_d0,&local_40);
  local_40.m_lhs = Nz;
  local_40.m_rhs = pCVar10;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,11,1,1,11>,Eigen::Matrix<double,11,3,1,11,3>,0>>
            (Nz_d0,&local_40);
  dVar1 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  dVar2 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar3 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar4 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  dVar5 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  dVar6 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar6;
  dVar7 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar8 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar8;
  dVar9 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar9;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar4 * dVar3;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 * dVar2 * dVar5;
  auVar15 = vfmadd231sd_fma(auVar20,auVar18,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar8 * dVar7;
  auVar15 = vfmadd213sd_fma(auVar16,auVar21,auVar15);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar5 * dVar3;
  auVar15 = vfnmadd213sd_fma(auVar11,auVar19,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar9 * dVar2;
  auVar15 = vfnmadd213sd_fma(auVar17,auVar14,auVar15);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar7 * dVar6;
  auVar15 = vfnmadd213sd_fma(auVar12,auVar13,auVar15);
  return auVar15._0_8_;
}

Assistant:

double ChElementHexaANCF_3813_9::Calc_detJ0(double x,
                                            double y,
                                            double z,
                                            ShapeVector& Nx,
                                            ShapeVector& Ny,
                                            ShapeVector& Nz,
                                            ChMatrixNM<double, 1, 3>& Nx_d0,
                                            ChMatrixNM<double, 1, 3>& Ny_d0,
                                            ChMatrixNM<double, 1, 3>& Nz_d0) {
    ShapeFunctionsDerivativeX(Nx, x, y, z);
    ShapeFunctionsDerivativeY(Ny, x, y, z);
    ShapeFunctionsDerivativeZ(Nz, x, y, z);

    Nx_d0 = Nx * m_d0;
    Ny_d0 = Ny * m_d0;
    Nz_d0 = Nz * m_d0;

    double detJ0 = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
                   Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
                   Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    return detJ0;
}